

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool sx_strnequal(char *a,char *b,int num)

{
  char *pcVar1;
  char *pcVar2;
  int var__b_1;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int var__a;
  int var__b;
  ulong uVar6;
  
  uVar3 = sx_strlen(a);
  uVar4 = sx_strlen(b);
  if (num <= (int)uVar3) {
    uVar3 = num;
  }
  if ((int)uVar4 < num) {
    num = uVar4;
  }
  uVar5 = 0;
  if (uVar3 == num) {
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar6 = 0;
    }
    do {
      if (uVar6 == uVar5) {
        uVar5 = (ulong)((long)(int)uVar3 <= (long)uVar5);
        goto LAB_00108ecc;
      }
      pcVar1 = a + uVar5;
      pcVar2 = b + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pcVar1 == *pcVar2);
    uVar5 = 0;
  }
LAB_00108ecc:
  return SUB81(uVar5,0);
}

Assistant:

bool sx_strnequal(const char* SX_RESTRICT a, const char* SX_RESTRICT b, int num)
{
    int _alen = sx_strlen(a);
    int _blen = sx_strlen(b);
    int alen = sx_min(num, _alen);
    int blen = sx_min(num, _blen);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (a[i] != b[i])
            return false;
    }
    return true;
}